

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_(anonymous_namespace)::nonUniformTileConfigParam,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::Advance
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  ParamIterator<aom_rc_mode> *in_RDI;
  
  std::
  get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<libaom_test::TestMode>,testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,testing::internal::ParamIterator<aom_rc_mode>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<(anonymous_namespace)::nonUniformTileConfigParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
              *)0x66650c);
  ParamIterator<aom_rc_mode>::operator++(in_RDI);
  CartesianProductGenerator<libaom_test::CodecFactory_const*,libaom_test::TestMode,(anonymous_namespace)::nonUniformTileConfigParam,aom_rc_mode>
  ::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>>::AdvanceIfEnd<3ul>(this);
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }